

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtconcurrentthreadengine.cpp
# Opt level: O3

void __thiscall QtConcurrent::ThreadEngineBase::run(ThreadEngineBase *this)

{
  long lVar1;
  QFutureInterfaceBase *pQVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->futureInterface == (QFutureInterfaceBase *)0x0) {
LAB_00102c7f:
    do {
      cVar3 = (**(code **)(*(long *)this + 0x30))(this);
      if (cVar3 == '\0') break;
      bVar4 = startThreadInternal(this);
    } while (bVar4);
    while( true ) {
      iVar5 = (**(code **)(*(long *)this + 0x28))(this);
      if (iVar5 != 0) break;
      bVar4 = ThreadEngineBarrier::releaseUnlessLast(&this->barrier);
      if (bVar4) goto LAB_00102d50;
      reportIfSuspensionDone(this);
    }
    pQVar2 = this->futureInterface;
    iVar5 = ThreadEngineBarrier::release(&this->barrier);
    if ((iVar5 == 0) && (pQVar2 != (QFutureInterfaceBase *)0x0)) {
      (**(code **)(*(long *)this + 0x40))(this);
    }
  }
  else {
    cVar3 = QFutureInterfaceBase::isCanceled();
    if (cVar3 == '\0') goto LAB_00102c7f;
    pQVar2 = this->futureInterface;
    iVar5 = ThreadEngineBarrier::release(&this->barrier);
    if ((iVar5 == 0) && (pQVar2 != (QFutureInterfaceBase *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        (**(code **)(*(long *)this + 0x40))(this);
        return;
      }
      goto LAB_00102dba;
    }
  }
LAB_00102d50:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00102dba:
  __stack_chk_fail();
}

Assistant:

void ThreadEngineBase::run() // implements QRunnable.
{
    if (this->isCanceled()) {
        threadExit();
        return;
    }

    startThreads();

#ifndef QT_NO_EXCEPTIONS
    try {
#endif
        while (threadFunction() == ThrottleThread) {
            // threadFunction returning ThrottleThread means it that the user
            // struct wants to be throttled by making a worker thread exit.
            // Respect that request unless this is the only worker thread left
            // running, in which case it has to keep going.
            if (threadThrottleExit()) {
                return;
            } else {
                // If the last worker thread is throttled and the state is "suspending",
                // it means that suspension has been requested, and it is already
                // in effect (because all previous threads have already exited).
                // Report the "Suspended" state.
                reportIfSuspensionDone();
            }
        }

#ifndef QT_NO_EXCEPTIONS
    } catch (QException &e) {
        handleException(e);
    } catch (...) {
        handleException(QUnhandledException(std::current_exception()));
    }
#endif
    threadExit();
}